

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt.c
# Opt level: O2

int gopt(char **argv,option *options)

{
  option *poVar1;
  char cVar2;
  char *__s;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t __n;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  int local_5c;
  uint local_3c;
  
  uVar3 = 0;
  while (poVar1 = options + uVar3, (options[uVar3].flags & 0x100) == 0) {
    poVar1->argument = (char *)0x0;
    poVar1->count = 0;
    uVar3 = uVar3 + 1;
  }
  poVar1->short_name = '\0';
  poVar1->long_name = (char *)0x0;
  poVar1->argument = (char *)0x0;
  poVar1->count = 0;
  bVar13 = false;
  uVar3 = 0;
  uVar11 = 0;
  uVar9 = 1;
  uVar5 = 1;
  do {
    pcVar12 = argv[uVar9];
    iVar4 = (int)uVar5;
    if (pcVar12 == (char *)0x0) {
      if (uVar3 != 0) {
        options[uVar11].flags = options[uVar11].flags | uVar3 >> 1;
        options[uVar11].argument = (char *)0x0;
      }
      argv[uVar5] = (char *)0x0;
      return iVar4;
    }
    if (bVar13) {
      argv[uVar5] = pcVar12;
      uVar5 = (ulong)(iVar4 + 1);
LAB_00102aac:
      bVar13 = true;
    }
    else {
      if (uVar3 == 0) {
LAB_00102b00:
        if ((*pcVar12 == '-') && (cVar2 = pcVar12[1], cVar2 != '\0')) {
          if (cVar2 != '-') {
            uVar3 = 0;
            uVar8 = 1;
            while (cVar2 != '\0') {
              uVar11 = 0;
              while( true ) {
                poVar1 = options + uVar11;
                uVar10 = options[uVar11].flags;
                iVar4 = (int)uVar8;
                if ((uVar10 >> 8 & 1) != 0) {
                  poVar1->count = poVar1->count + 1;
                  if (poVar1->short_name == '\0') {
                    poVar1->short_name = pcVar12[uVar8];
                  }
                  uVar8 = (ulong)(iVar4 + 1);
                  if (pcVar12[uVar8] != '\0') goto LAB_00102cba;
                  poVar1->argument = (char *)0x0;
                  uVar10 = uVar10 | 0x10;
                  goto LAB_00102d2f;
                }
                if (poVar1->short_name == cVar2) break;
                uVar11 = (ulong)((int)uVar11 + 1);
              }
              poVar1->count = poVar1->count + 1;
              if ((uVar10 & 1) == 0) {
                uVar8 = (ulong)(iVar4 + 1);
                if (pcVar12[uVar8] != '\0') {
LAB_00102cba:
                  poVar1->argument = pcVar12 + uVar8;
                  uVar10 = uVar10 | 0x20;
LAB_00102d2f:
                  poVar1->flags = uVar10;
                  break;
                }
                if ((uVar10 & 2) == 0) {
                  poVar1->argument = (char *)0x0;
                  poVar1->flags = uVar10 | 0x10;
                }
                else {
                  uVar3 = 0x20;
                }
              }
              else {
                poVar1->argument = (char *)0x0;
                poVar1->flags = uVar10 | 0x10;
                uVar8 = (ulong)(iVar4 + 1);
              }
              pcVar12 = argv[uVar9];
              cVar2 = pcVar12[uVar8];
            }
            bVar13 = false;
            goto LAB_00102c08;
          }
          if (pcVar12[2] == '\0') {
            uVar3 = 0;
            goto LAB_00102aac;
          }
          pcVar12 = pcVar12 + 2;
          pcVar6 = strchr(pcVar12,0x3d);
          __n = strcspn(pcVar12,"=");
          uVar11 = 0;
          local_5c = 0;
          while( true ) {
            uVar3 = options[uVar11].flags;
            if ((uVar3 >> 8 & 1) != 0) break;
            __s = options[uVar11].long_name;
            if (((__s != (char *)0x0) && (sVar7 = strlen(__s), __n <= sVar7)) &&
               (iVar4 = strncasecmp(__s,pcVar12,__n), iVar4 == 0)) {
              if (__n == sVar7) {
                bVar13 = true;
                goto LAB_00102ce9;
              }
              local_5c = local_5c + 1;
              local_3c = (uint)uVar11;
            }
            uVar11 = (ulong)((uint)uVar11 + 1);
          }
          if (local_5c == 1) {
            uVar11 = (ulong)local_3c;
          }
          uVar3 = options[uVar11].flags;
          bVar13 = (uVar3 >> 8 & 1) == 0;
LAB_00102ce9:
          options[uVar11].count = options[uVar11].count + 1;
          if ((!bVar13) && (options[uVar11].long_name == (char *)0x0)) {
            options[uVar11].long_name = pcVar12;
          }
          if (pcVar6 == (char *)0x0) {
            if ((uVar3 & 2) == 0) {
              options[uVar11].argument = (char *)0x0;
              uVar3 = uVar3 | 0x40;
              goto LAB_00102d55;
            }
            uVar3 = 0x80;
          }
          else {
            options[uVar11].argument = pcVar6 + 1;
            uVar3 = uVar3 | 0x80;
LAB_00102d55:
            options[uVar11].flags = uVar3;
            uVar3 = 0;
          }
          bVar13 = false;
          goto LAB_00102c08;
        }
        argv[uVar5] = pcVar12;
        uVar5 = (ulong)(iVar4 + 1);
      }
      else {
        if ((*pcVar12 == '-') && (pcVar12[1] != '\0')) {
          if ((options[uVar11].flags & 4) != 0) {
            options[uVar11].flags = options[uVar11].flags | uVar3 >> 1;
            options[uVar11].argument = (char *)0x0;
            pcVar12 = argv[uVar9];
            goto LAB_00102b00;
          }
        }
        options[uVar11].flags = options[uVar11].flags | uVar3;
        options[uVar11].argument = pcVar12;
      }
      bVar13 = false;
      uVar3 = 0;
    }
LAB_00102c08:
    uVar9 = (ulong)((int)uVar9 + 1);
  } while( true );
}

Assistant:

int gopt (char **argv, struct option *options)
{
  unsigned int operand_count = 1;
  unsigned int doubledash    = 0;
  unsigned int expecting     = 0;
  unsigned int option_index  = 0;
  unsigned int i, j;

  for (i = 0; !(options[i].flags & GOPT_LAST); i++)
  {
    options[i].argument = NULL;
    options[i].count    = 0;
  }

  options[i].short_name = 0;
  options[i].long_name  = NULL;
  options[i].argument   = NULL;
  options[i].count      = 0;

  for (i = 1; argv[i]; i++)
  {
    if (doubledash)
    {
      argv[operand_count] = argv[i];
      operand_count++;
      continue;
    }

    if (expecting)
    {
      if ((argv[i][0] != '-') || !argv[i][1] || !(options[option_index].flags & GOPT_ARGUMENT_NO_HYPHEN))
      {
        options[option_index].flags    |= expecting;
        options[option_index].argument  = argv[i];
        expecting = 0;
        continue;
      }
      else
      {
        options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
        options[option_index].argument  =  NULL;
        expecting = 0;
      }
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-') && (argv[i][2] == 0))
    {
      doubledash = 1;
      continue;
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-'))
    {
      char *eq = strchr (&argv[i][2], '=');

      option_index = long_option_get_index (&argv[i][2], options);

      options[option_index].count++;

      if ((options[option_index].flags & GOPT_LAST) && !options[option_index].long_name)
      {
        options[option_index].long_name = &argv[i][2];
      }

      if (eq)
      {
        options[option_index].argument  = (eq + 1);
        options[option_index].flags    |= GOPT_SEEN_LONG_WITH;
      }
      else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
      {
        expecting = GOPT_SEEN_LONG_WITH;
      }
      else
      {
        options[option_index].argument  = NULL;
        options[option_index].flags    |= GOPT_SEEN_LONG_WITHOUT;
      }
    }
    else if ((argv[i][0] == '-') && argv[i][1])
    {
      for (j = 1; argv[i][j]; j++)
      {
        option_index = short_option_get_index (argv[i][j], options);

        options[option_index].count++;

        if (options[option_index].flags & GOPT_LAST)
        {
          if (!options[option_index].short_name)
          {
            options[option_index].short_name = argv[i][j];
          }

          if (argv[i][j+1])
          {
            options[option_index].argument  = &argv[i][j+1];
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          }
          else
          {
            options[option_index].argument  = NULL;
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
          }
          break;
        }

        if (options[option_index].flags & GOPT_ARGUMENT_FORBIDDEN)
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }

        else if (argv[i][j+1])
        {
          options[option_index].argument  = &argv[i][j+1];
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          break;
        }

        else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
        {
          expecting = GOPT_SEEN_SHORT_WITH;
        }

        else
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }
      }
    }
    else
    {
      argv[operand_count] = argv[i];
      operand_count++;
    }
  }

  if (expecting)
  {
    options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
    options[option_index].argument  =  NULL;
  }

  argv[operand_count] = NULL;
  return operand_count;
}